

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseUse(Parser *this)

{
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var1;
  _func_int ***ppp_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer puVar5;
  bool bVar6;
  Parser *in_RSI;
  undefined1 local_88 [16];
  Exprs exprs;
  Token *tok;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  
  sanityExpect(in_RSI,TOK_KW_USE);
  bVar6 = expect(in_RSI,TOK_KW_MOD);
  if (bVar6) {
    tok = in_RSI->lexer->currentToken;
    bVar6 = expect(in_RSI,TOK_ID);
    if (bVar6) {
      std::make_unique<pfederc::ProgNameExpr,pfederc::Lexer&,pfederc::Token_const*&>
                ((Lexer *)&exprs,(Token **)in_RSI->lexer);
      puVar5 = exprs.
               super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      exprs.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      this->lexer = (Lexer *)puVar5;
      std::unique_ptr<pfederc::ProgNameExpr,_std::default_delete<pfederc::ProgNameExpr>_>::
      ~unique_ptr((unique_ptr<pfederc::ProgNameExpr,_std::default_delete<pfederc::ProgNameExpr>_> *)
                  &exprs);
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
    }
    local_88._8_2_ = 2;
    local_88._0_4_ = 8;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&exprs,(SyntaxErrorCode *)(local_88 + 8),(Position *)local_88);
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&exprs);
  }
  else {
    parseExpression((Parser *)local_88,(Precedence)in_RSI);
    if ((Lexer *)local_88._0_8_ != (Lexer *)0x0) {
      tok = (Token *)((Position *)(local_88._0_8_ + 0x20))->line;
      aStack_50._M_allocated_capacity =
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&((Position *)(local_88._0_8_ + 0x20))->startIndex)->_M_allocated_capacity;
      aStack_50._8_8_ = ((Position *)(local_88._0_8_ + 0x20))->endIndex;
      exprs.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      exprs.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      exprs.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _Var1._M_head_impl = (Expr *)local_88._0_8_;
      while( true ) {
        local_88._0_8_ = _Var1._M_head_impl;
        bVar6 = isBiOpExpr((Expr *)local_88._0_8_,TOK_OP_COMMA);
        uVar3 = local_88._0_8_;
        if (!bVar6) {
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::_M_insert_rval(&exprs,(const_iterator)
                                  exprs.
                                  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_88);
          std::
          make_unique<pfederc::UseExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                    ((Lexer *)(local_88 + 8),(Position *)in_RSI->lexer,
                     (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                      *)&tok);
          uVar3 = local_88._8_8_;
          local_88._8_8_ = (pointer)0x0;
          this->lexer = (Lexer *)uVar3;
          std::unique_ptr<pfederc::UseExpr,_std::default_delete<pfederc::UseExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::UseExpr,_std::default_delete<pfederc::UseExpr>_> *)
                     (local_88 + 8));
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::~vector(&exprs);
          if ((Lexer *)local_88._0_8_ == (Lexer *)0x0) {
            return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                   (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                   this;
          }
          (*(*(_func_int ***)local_88._0_8_)[1])();
          return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                 (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                 this;
        }
        if (*(_func_int ***)local_88._0_8_ != (_func_int **)&PTR__BiOpExpr_00128998) break;
        local_88._8_8_ = *(undefined8 *)&((Expr *)(local_88._0_8_ + 0x38))->type;
        *(undefined8 *)&((Expr *)(local_88._0_8_ + 0x38))->type = 0;
        std::
        vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::_M_insert_rval(&exprs,(const_iterator)
                                exprs.
                                super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                         (value_type *)(local_88 + 8));
        if ((Lexer *)local_88._8_8_ != (Lexer *)0x0) {
          (*(*(_func_int ***)local_88._8_8_)[1])();
        }
        uVar4 = local_88._0_8_;
        _Var1._M_head_impl = (Expr *)((Expr *)(uVar3 + 0x38))->lexer;
        ((Expr *)(uVar3 + 0x38))->lexer = (Lexer *)0x0;
        if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_88._0_8_ !=
            (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
          ppp_Var2 = (_func_int ***)local_88._0_8_;
          local_88._0_8_ = _Var1._M_head_impl;
          (*(*ppp_Var2)[1])(uVar4);
          _Var1._M_head_impl = (Expr *)local_88._0_8_;
        }
      }
      __cxa_bad_cast();
    }
  }
  this->lexer = (Lexer *)0x0;
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseUse() noexcept {
  sanityExpect(TokenType::TOK_KW_USE);
  if (expect(TokenType::TOK_KW_MOD)) {
    const Token *tok = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ID)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ID, lexer.getCurrentToken()->getPosition()));
      return nullptr;
    }

    return std::make_unique<ProgNameExpr>(lexer, tok);
  }

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr)
    return nullptr;

  Position pos(expr->getPosition());

  Exprs exprs;
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr& biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    exprs.insert(exprs.begin(), biopexpr.getRightPtr());
    expr = biopexpr.getLeftPtr();
  }

  exprs.insert(exprs.begin(), std::move(expr));

  return std::make_unique<UseExpr>(lexer, pos, std::move(exprs));
}